

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_append_filter.c
# Opt level: O0

int archive_read_append_filter_program_signature
              (archive *_a,char *cmd,void *signature,size_t signature_len)

{
  int iVar1;
  void *pvVar2;
  archive_read *a;
  archive_read_filter *filter;
  archive_read_filter_bidder *bidder;
  int i;
  int number_bidders;
  int r;
  size_t signature_len_local;
  void *signature_local;
  char *cmd_local;
  archive *_a_local;
  
  iVar1 = archive_read_support_filter_program_signature(_a,cmd,signature,signature_len);
  if (iVar1 == 0) {
    bidder._4_4_ = 0;
    for (filter = (archive_read_filter *)&_a[1].read_data_offset;
        (bidder._4_4_ < 0x10 &&
        ((filter->position == 0 || (filter->bidder != (archive_read_filter_bidder *)0x0))));
        filter = (archive_read_filter *)&filter->archive) {
      bidder._4_4_ = bidder._4_4_ + 1;
    }
    if (filter->position == 0) {
      archive_set_error(_a,0x16,"Internal error: Unable to append program filter");
      _a_local._4_4_ = -0x1e;
    }
    else {
      pvVar2 = calloc(1,0x90);
      if (pvVar2 == (void *)0x0) {
        archive_set_error(_a,0xc,"Out of memory");
        _a_local._4_4_ = -0x1e;
      }
      else {
        *(archive_read_filter **)((long)pvVar2 + 8) = filter;
        *(archive **)((long)pvVar2 + 0x18) = _a;
        *(size_t *)((long)pvVar2 + 0x10) = _a[4].error_string.length;
        _a[4].error_string.length = (size_t)pvVar2;
        iVar1 = (*(code *)filter->upstream->bidder)(_a[4].error_string.length);
        if (iVar1 == 0) {
          filter->bidder = *(archive_read_filter_bidder **)(_a[4].error_string.length + 0x30);
          *(undefined4 *)&_a[4].error_string.buffer_length = 1;
          _a_local._4_4_ = 0;
        }
        else {
          __archive_read_free_filters((archive_read *)_a);
          _a_local._4_4_ = -0x1e;
        }
      }
    }
  }
  else {
    _a_local._4_4_ = -0x1e;
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_read_append_filter_program_signature(struct archive *_a,
  const char *cmd, const void *signature, size_t signature_len)
{
  int r, number_bidders, i;
  struct archive_read_filter_bidder *bidder;
  struct archive_read_filter *filter;
  struct archive_read *a = (struct archive_read *)_a;

  if (archive_read_support_filter_program_signature(_a, cmd, signature,
    signature_len) != (ARCHIVE_OK))
    return (ARCHIVE_FATAL);

  number_bidders = sizeof(a->bidders) / sizeof(a->bidders[0]);

  bidder = a->bidders;
  for (i = 0; i < number_bidders; i++, bidder++)
  {
    /* Program bidder name set to filter name after initialization */
    if (bidder->data && !bidder->name)
      break;
  }
  if (!bidder->data)
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
        "Internal error: Unable to append program filter");
    return (ARCHIVE_FATAL);
  }

  filter = calloc(1, sizeof(*filter));
  if (filter == NULL)
  {
    archive_set_error(&a->archive, ENOMEM, "Out of memory");
    return (ARCHIVE_FATAL);
  }
  filter->bidder = bidder;
  filter->archive = a;
  filter->upstream = a->filter;
  a->filter = filter;
  r = (bidder->vtable->init)(a->filter);
  if (r != ARCHIVE_OK) {
    __archive_read_free_filters(a);
    return (ARCHIVE_FATAL);
  }
  bidder->name = a->filter->name;

  a->bypass_filter_bidding = 1;
  return r;
}